

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_fitness(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_HISTOGRAM ref_histogram;
  REF_GRID ref_grid_local;
  
  ref_histogram = (REF_HISTOGRAM)ref_grid;
  uVar1 = ref_histogram_create((REF_HISTOGRAM *)&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    uVar1 = ref_histogram_add_fitness(_ref_private_macro_code_rss_1,(REF_GRID)ref_histogram);
    if (uVar1 == 0) {
      if ((*(int *)((long)ref_histogram->max + 4) == 0) &&
         (ref_grid_local._4_4_ =
               ref_histogram_print(_ref_private_macro_code_rss_1,(REF_GRID)ref_histogram,"fitness"),
         ref_grid_local._4_4_ != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x211,"ref_histogram_fitness",(ulong)ref_grid_local._4_4_,"print");
      }
      else {
        ref_grid_local._4_4_ = ref_histogram_free(_ref_private_macro_code_rss_1);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x213,"ref_histogram_fitness",(ulong)ref_grid_local._4_4_,"free gram");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x20e,"ref_histogram_fitness",(ulong)uVar1,"add fitness");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x20c,"ref_histogram_fitness",(ulong)uVar1,"create");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_fitness(REF_GRID ref_grid) {
  REF_HISTOGRAM ref_histogram;

  RSS(ref_histogram_create(&ref_histogram), "create");

  RSS(ref_histogram_add_fitness(ref_histogram, ref_grid), "add fitness");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_print(ref_histogram, ref_grid, "fitness"), "print");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}